

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O3

ON_Curve * __thiscall ON_Hatch::LoopCurve3d(ON_Hatch *this,int index)

{
  int iVar1;
  undefined4 extraout_var;
  ON_Xform xf;
  ON_Xform OStack_98;
  ON_Curve *pOVar2;
  
  if (((-1 < index) && (index < (this->m_loops).m_count)) &&
     (pOVar2 = (this->m_loops).m_a[(uint)index]->m_p2dCurve, pOVar2 != (ON_Curve *)0x0)) {
    iVar1 = (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])();
    pOVar2 = (ON_Curve *)CONCAT44(extraout_var,iVar1);
    if (pOVar2 != (ON_Curve *)0x0) {
      (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(pOVar2,3);
      ON_Xform::ON_Xform(&OStack_98);
      ON_Xform::Rotation(&OStack_98,&ON_xy_plane,&this->m_plane);
      (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1c])(pOVar2,&OStack_98);
      return pOVar2;
    }
  }
  return (ON_Curve *)0x0;
}

Assistant:

ON_Curve* ON_Hatch::LoopCurve3d( int index) const
{
  int count = m_loops.Count();
  ON_Curve* pC = nullptr;

  if( index >= 0 && index < count)
  {
    if( m_loops[index]->Curve())
    {
      pC = m_loops[index]->Curve()->DuplicateCurve();
      if( pC)
      {
        pC->ChangeDimension( 3);

        ON_Xform xf;
        xf.Rotation( ON_xy_plane, m_plane);

        pC->Transform( xf);
      }
    }
  }
  return pC;
}